

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

bool __thiscall argo::json::operator<=(json *this,json *other)

{
  type tVar1;
  type tVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  string *psVar8;
  ulong uVar9;
  json_exception *this_00;
  char *first_json_type_name;
  char *second_json_type_name;
  double dVar10;
  double dVar11;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  tVar1 = this->m_type;
  tVar2 = other->m_type;
  if (tVar2 != string_e || tVar1 != string_e) {
    if (tVar2 == number_int_e && (tVar1 ^ number_int_e) == object_e) {
      iVar6 = operator_cast_to_int(this);
      iVar7 = operator_cast_to_int(other);
      return iVar6 <= iVar7;
    }
    if (((tVar2 & ~array_e) != number_int_e || tVar1 != number_double_e) &&
       ((tVar1 ^ number_int_e) != object_e || tVar2 != number_double_e)) {
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      first_json_type_name = get_instance_type_name(this);
      second_json_type_name = get_instance_type_name(other);
      json_exception::json_exception
                (this_00,types_not_comparable_e,first_json_type_name,second_json_type_name);
      __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
    }
    dVar10 = operator_cast_to_double(this);
    dVar11 = operator_cast_to_double(other);
    return dVar10 <= dVar11;
  }
  psVar8 = operator_cast_to_string_(this);
  pcVar3 = (psVar8->_M_dataplus)._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + psVar8->_M_string_length);
  psVar8 = operator_cast_to_string_(other);
  pcVar3 = (psVar8->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + psVar8->_M_string_length);
  puVar4 = local_50;
  uVar9 = local_68;
  if (local_48 < local_68) {
    uVar9 = local_48;
  }
  if (uVar9 != 0) {
    uVar5 = memcmp(local_70,local_50,uVar9);
    uVar9 = (ulong)uVar5;
    if (uVar5 != 0) goto LAB_0010ea46;
  }
  uVar9 = 0xffffffff80000000;
  if (-0x80000000 < (long)(local_68 - local_48)) {
    uVar9 = local_68 - local_48;
  }
  if (0x7ffffffe < (long)uVar9) {
    uVar9 = 0x7fffffff;
  }
LAB_0010ea46:
  if (puVar4 != local_40) {
    operator_delete(puVar4);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return (int)uVar9 < 1;
}

Assistant:

bool json::operator<=(const json &other) const
{
    if (m_type == string_e && other.m_type == string_e)
    {
        return static_cast<string>(*this) <= static_cast<string>(other);
    }
    else if (m_type == number_int_e && other.m_type == number_int_e)
    {
        return static_cast<int>(*this) <= static_cast<int>(other);
    }
    else if ((m_type == number_double_e && other.m_type == number_double_e) ||
             (m_type == number_double_e && other.m_type == number_int_e) ||
             (m_type == number_int_e && other.m_type == number_double_e))
    {
        return static_cast<double>(*this) <= static_cast<double>(other);
    }
    else
    {
        throw json_exception(
                        json_exception::types_not_comparable_e,
                        get_instance_type_name(),
                        other.get_instance_type_name());
    }
}